

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O0

void __thiscall HdlcAnalyzerSettings::LoadSettings(HdlcAnalyzerSettings *this,char *settings)

{
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  HdlcAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  SimpleArchive::operator>>(local_20,&this->mTransmissionMode);
  SimpleArchive::operator>>(local_20,&this->mHdlcAddr);
  SimpleArchive::operator>>(local_20,&this->mHdlcControl);
  SimpleArchive::operator>>(local_20,&this->mHdlcFcs);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void HdlcAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> *( U32* )&mTransmissionMode;
    text_archive >> *( U32* )&mHdlcAddr;
    text_archive >> *( U32* )&mHdlcControl;
    text_archive >> *( U32* )&mHdlcFcs;

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", true );

    UpdateInterfacesFromSettings();
}